

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSphere
          (SceneGraph *this,Vec3fa *center,float radius,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *ptr;
  undefined8 uVar4;
  PointSetNode *this_00;
  Vec3fx *pVVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  Ref<embree::SceneGraph::MaterialNode> local_40;
  float local_34;
  
  local_34 = radius;
  this_00 = (PointSetNode *)operator_new(0xb0);
  local_40 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_40.ptr != (MaterialNode *)0x0) {
    (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  PointSetNode::PointSetNode
            (this_00,RTC_GEOMETRY_TYPE_SPHERE_POINT,&local_40,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_40.ptr != (MaterialNode *)0x0) {
    (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar8 = pvVar3->size_alloced + (ulong)(pvVar3->size_alloced == 0);
  if (1 < pvVar3->size_active) {
    pvVar3->size_active = 1;
  }
  if (pvVar3->size_alloced == sVar8) {
    pvVar3->size_active = 1;
  }
  else {
    ptr = pvVar3->items;
    pVVar5 = (Vec3fx *)alignedMalloc(sVar8 * 0x10,0x10);
    pvVar3->items = pVVar5;
    if (pvVar3->size_active != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar6);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < pvVar3->size_active);
    }
    alignedFree(ptr);
    pvVar3->size_active = 1;
    pvVar3->size_alloced = sVar8;
  }
  (((this_00->positions).
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->items->field_0).m128[0] = (center->field_0).m128[0];
  (((this_00->positions).
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->items->field_0).m128[1] = (center->field_0).m128[1];
  (((this_00->positions).
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->items->field_0).m128[2] = (center->field_0).m128[2];
  (((this_00->positions).
    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->items->field_0).m128[3] = local_34;
  *(PointSetNode **)this = this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphere (const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    RTCGeometryType type = RTC_GEOMETRY_TYPE_SPHERE_POINT;
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type, material, BBox1f(0,1), 1);
    mesh->positions[0].resize(1);
    mesh->positions[0][0].x = center.x;
    mesh->positions[0][0].y = center.y;
    mesh->positions[0][0].z = center.z;
    mesh->positions[0][0].w = radius;
    return mesh.dynamicCast<SceneGraph::Node>();
  }